

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls13_enc.cc
# Opt level: O2

bool bssl::tls13_derive_application_secrets(SSL_HANDSHAKE *hs)

{
  SSL *this;
  bool bVar1;
  size_t in_R8;
  Span<const_unsigned_char> secret;
  Span<const_unsigned_char> secret_00;
  Span<const_unsigned_char> secret_01;
  string_view label;
  string_view label_00;
  string_view label_01;
  
  this = hs->ssl;
  label._M_str = "c ap traffic";
  label._M_len = 0xc;
  bVar1 = derive_secret(hs,&hs->client_traffic_secret_0,label);
  if (bVar1) {
    secret.data_ = (uchar *)(ulong)(hs->client_traffic_secret_0).size_;
    secret.size_ = in_R8;
    bVar1 = ssl_log_secret((bssl *)this,(SSL *)"CLIENT_TRAFFIC_SECRET_0",
                           (hs->client_traffic_secret_0).storage_,secret);
    if (bVar1) {
      label_00._M_str = "s ap traffic";
      label_00._M_len = 0xc;
      bVar1 = derive_secret(hs,&hs->server_traffic_secret_0,label_00);
      if (bVar1) {
        secret_00.data_ = (uchar *)(ulong)(hs->server_traffic_secret_0).size_;
        secret_00.size_ = in_R8;
        bVar1 = ssl_log_secret((bssl *)this,(SSL *)"SERVER_TRAFFIC_SECRET_0",
                               (hs->server_traffic_secret_0).storage_,secret_00);
        if (bVar1) {
          label_01._M_str = "exp master";
          label_01._M_len = 10;
          bVar1 = derive_secret(hs,&this->s3->exporter_secret,label_01);
          if (bVar1) {
            secret_01.data_ = (uchar *)(ulong)(this->s3->exporter_secret).size_;
            secret_01.size_ = in_R8;
            bVar1 = ssl_log_secret((bssl *)this,(SSL *)"EXPORTER_SECRET",
                                   (this->s3->exporter_secret).storage_,secret_01);
            return bVar1;
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool tls13_derive_application_secrets(SSL_HANDSHAKE *hs) {
  SSL *const ssl = hs->ssl;
  if (!derive_secret(hs, &hs->client_traffic_secret_0,
                     kTLS13LabelClientApplicationTraffic) ||
      !ssl_log_secret(ssl, "CLIENT_TRAFFIC_SECRET_0",
                      hs->client_traffic_secret_0) ||
      !derive_secret(hs, &hs->server_traffic_secret_0,
                     kTLS13LabelServerApplicationTraffic) ||
      !ssl_log_secret(ssl, "SERVER_TRAFFIC_SECRET_0",
                      hs->server_traffic_secret_0) ||
      !derive_secret(hs, &ssl->s3->exporter_secret, kTLS13LabelExporter) ||
      !ssl_log_secret(ssl, "EXPORTER_SECRET", ssl->s3->exporter_secret)) {
    return false;
  }

  return true;
}